

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

int nn_sock_hold(nn_sock *self)

{
  int iVar1;
  
  if (self->state - 1U < 2) {
    self->holds = self->holds + 1;
    return 0;
  }
  iVar1 = -0x9523dfd;
  if (self->state != 3) {
    iVar1 = -9;
  }
  return iVar1;
}

Assistant:

int nn_sock_hold (struct nn_sock *self)
{
    switch (self->state) {
    case NN_SOCK_STATE_ACTIVE:
    case NN_SOCK_STATE_INIT:
        self->holds++;
        return 0;
    case NN_SOCK_STATE_ZOMBIE:
        return -ETERM;
    case NN_SOCK_STATE_STOPPING:
    case NN_SOCK_STATE_STOPPING_EPS:
    case NN_SOCK_STATE_FINI:
    default:
        return -EBADF;
    }
}